

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  ImVec4 *pIVar2;
  ImVec4 *pIVar3;
  int iVar4;
  ImGuiTable *pIVar5;
  ImGuiWindow *pIVar6;
  char *pcVar7;
  ImGuiColorMod *pIVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  char *pcVar14;
  long lVar15;
  
  pIVar12 = GImGui;
  do {
    if ((pIVar12->CurrentWindowStack).Size < 1) {
      return;
    }
    pIVar5 = pIVar12->CurrentTable;
    while (pIVar5 != (ImGuiTable *)0x0) {
      if ((pIVar5->OuterWindow != pIVar12->CurrentWindow) &&
         (pIVar5->InnerWindow != pIVar12->CurrentWindow)) break;
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                        pIVar5->OuterWindow->Name);
      }
      EndTable();
      pIVar5 = pIVar12->CurrentTable;
    }
    pIVar6 = pIVar12->CurrentWindow;
    while (pIVar12->CurrentTabBar != (ImGuiTabBar *)0x0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar6->Name);
      }
      EndTabBar();
    }
    while (0 < (pIVar6->DC).TreeDepth) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar6->Name);
      }
      TreePop();
    }
    while ((int)(pIVar6->DC).StackSizesOnBegin.SizeOfGroupStack < (pIVar12->GroupStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar6->Name);
      }
      EndGroup();
    }
    iVar4 = (pIVar6->IDStack).Size;
    while (1 < iVar4) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar6->Name);
      }
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
      iVar4 = (pIVar6->IDStack).Size;
    }
    while (iVar4 = (pIVar12->ColorStack).Size,
          (pIVar6->DC).StackSizesOnBegin.SizeOfColorStack < iVar4) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        pcVar7 = pIVar6->Name;
        pcVar14 = GetStyleColorName((pIVar12->ColorStack).Data[(long)iVar4 + -1].Col);
        (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s"
                        ,pcVar7,pcVar14);
      }
      pIVar13 = GImGui;
      pIVar8 = (GImGui->ColorStack).Data;
      lVar15 = (long)(GImGui->ColorStack).Size;
      pIVar2 = &pIVar8[lVar15 + -1].BackupValue;
      fVar9 = pIVar2->y;
      fVar10 = pIVar2->z;
      fVar11 = pIVar2->w;
      pIVar3 = (GImGui->Style).Colors + pIVar8[lVar15 + -1].Col;
      pIVar3->x = pIVar2->x;
      pIVar3->y = fVar9;
      pIVar3->z = fVar10;
      pIVar3->w = fVar11;
      (pIVar13->ColorStack).Size = (pIVar13->ColorStack).Size + -1;
    }
    while ((int)(pIVar6->DC).StackSizesOnBegin.SizeOfStyleVarStack < (pIVar12->StyleVarStack).Size)
    {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar6->Name);
      }
      PopStyleVar(1);
    }
    while ((int)(pIVar6->DC).StackSizesOnBegin.SizeOfFocusScopeStack <
           (pIVar12->FocusScopeStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar6->Name);
      }
      pIVar13 = GImGui;
      iVar4 = (GImGui->FocusScopeStack).Size;
      (GImGui->CurrentWindow->DC).NavFocusScopeIdCurrent =
           (GImGui->FocusScopeStack).Data[(long)iVar4 + -1];
      (pIVar13->FocusScopeStack).Size = iVar4 + -1;
    }
    iVar4 = (pIVar12->CurrentWindowStack).Size;
    if (iVar4 == 1) {
      return;
    }
    if ((pIVar6->Flags & 0x1000000) == 0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing End() for \'%s\'",pIVar6->Name);
      }
      End();
    }
    else {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndChild() for \'%s\'",pIVar6->Name);
      }
      EndChild();
    }
    if (iVar4 == 1) {
      return;
    }
  } while( true );
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0)
    {
#ifdef IMGUI_HAS_TABLE
        while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
            EndTable();
        }
#endif
        ImGuiWindow* window = g.CurrentWindow;
        IM_ASSERT(window != NULL);
        while (g.CurrentTabBar != NULL) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
            EndTabBar();
        }
        while (window->DC.TreeDepth > 0)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
            TreePop();
        }
        while (g.GroupStack.Size > window->DC.StackSizesOnBegin.SizeOfGroupStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
            EndGroup();
        }
        while (window->IDStack.Size > 1)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
            PopID();
        }
        while (g.ColorStack.Size > window->DC.StackSizesOnBegin.SizeOfColorStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
            PopStyleColor();
        }
        while (g.StyleVarStack.Size > window->DC.StackSizesOnBegin.SizeOfStyleVarStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
            PopStyleVar();
        }
        while (g.FocusScopeStack.Size > window->DC.StackSizesOnBegin.SizeOfFocusScopeStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
            PopFocusScope();
        }
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(g.CurrentWindow->IsFallbackWindow);
            break;
        }
        IM_ASSERT(window == g.CurrentWindow);
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}